

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void free_parser(vw *all)

{
  io_buf *piVar1;
  parser *ppVar2;
  
  v_array<substring>::delete_v(&all->p->words);
  v_array<substring>::delete_v(&all->p->name);
  if ((all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    v_array<unsigned_long>::delete_v(&all->p->gram_mask);
  }
  ppVar2 = all->p;
  piVar1 = ppVar2->output;
  if (piVar1 != (io_buf *)0x0) {
    v_array<char>::delete_v(&piVar1->finalname);
    v_array<char>::delete_v(&piVar1->currentname);
    ppVar2 = all->p;
  }
  v_array<unsigned_long>::delete_v(&ppVar2->counts);
  return;
}

Assistant:

void free_parser(vw& all)
{
  all.p->words.delete_v();
  all.p->name.delete_v();

  if (all.ngram_strings.size() > 0)
    all.p->gram_mask.delete_v();

  io_buf* output = all.p->output;
  if (output != nullptr)
  {
    output->finalname.delete_v();
    output->currentname.delete_v();
  }

  all.p->counts.delete_v();
}